

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O0

void dlib::impl1::connect_all
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts,
               unsigned_long node_id)

{
  ulong uVar1;
  size_type sVar2;
  vector<dlib::network_address,_std::allocator<dlib::network_address>_> *in_RSI;
  ostream *in_RDI;
  unsigned_long *unaff_retaddr;
  unsigned_long id;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> con;
  unsigned_long i;
  range *in_stack_00000200;
  domain *in_stack_00000208;
  map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *in_stack_00000210;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *this;
  network_address *in_stack_ffffffffffffffc8;
  bsp_con *in_stack_ffffffffffffffd0;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> local_28;
  ulong local_20;
  vector<dlib::network_address,_std::allocator<dlib::network_address>_> *local_10;
  
  local_10 = in_RSI;
  map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::clear((map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *)0x3c46cd);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    sVar2 = std::vector<dlib::network_address,_std::allocator<dlib::network_address>_>::size
                      (local_10);
    if (sVar2 <= uVar1) break;
    operator_new(400);
    std::vector<dlib::network_address,_std::allocator<dlib::network_address>_>::operator[]
              (local_10,local_20);
    bsp_con::bsp_con(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this = &local_28;
    std::unique_ptr<dlib::impl1::bsp_con,std::default_delete<dlib::impl1::bsp_con>>::
    unique_ptr<std::default_delete<dlib::impl1::bsp_con>,void>(this,in_stack_ffffffffffffff98);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::operator->
              ((unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *)
               0x3c474b);
    dlib::serialize(unaff_retaddr,in_RDI);
    map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ::add(in_stack_00000210,in_stack_00000208,in_stack_00000200);
    std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>::~unique_ptr
              (this);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void connect_all (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts,
            unsigned long node_id
        )
        {
            cons.clear();
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                std::unique_ptr<bsp_con> con(new bsp_con(hosts[i]));
                dlib::serialize(node_id, con->stream); // tell the other end our node_id
                unsigned long id = i+1;
                cons.add(id, con);
            }
        }